

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::DOMLSParserImpl::canSetParameter(DOMLSParserImpl *this,XMLCh *name,void *param_2)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMResourceResolver);
  bVar2 = true;
  if (iVar1 != 0) {
    iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMErrorHandler);
    if (iVar1 != 0) {
      iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesEntityResolver);
      if (iVar1 != 0) {
        iVar1 = XMLString::compareIStringASCII
                          (name,(XMLCh *)XMLUni::fgXercesSchemaExternalSchemaLocation);
        if (iVar1 != 0) {
          iVar1 = XMLString::compareIStringASCII
                            (name,(XMLCh *)XMLUni::fgXercesSchemaExternalNoNameSpaceSchemaLocation);
          if (iVar1 != 0) {
            iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesSecurityManager);
            if (iVar1 != 0) {
              iVar1 = XMLString::compareIStringASCII
                                (name,L"http://apache.org/xml/properties/scannerName");
              if (iVar1 != 0) {
                iVar1 = XMLString::compareIStringASCII
                                  (name,(XMLCh *)XMLUni::fgXercesParserUseDocumentFromImplementation
                                  );
                if (iVar1 != 0) {
                  iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesLowWaterMark)
                  ;
                  if (iVar1 != 0) {
                    iVar1 = XMLString::compareIStringASCII
                                      (name,(XMLCh *)XMLUni::fgDOMSchemaLocation);
                    if (iVar1 != 0) {
                      XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMSchemaType);
                    }
                    bVar2 = false;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool DOMLSParserImpl::canSetParameter(const XMLCh* name, const void* /*value*/) const
{
    if (XMLString::compareIStringASCII(name, XMLUni::fgDOMResourceResolver) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgDOMErrorHandler) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesEntityResolver) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesSchemaExternalSchemaLocation) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesSchemaExternalNoNameSpaceSchemaLocation) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesSecurityManager) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesScannerName) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesParserUseDocumentFromImplementation) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesLowWaterMark) == 0)
      return true;
    else if(XMLString::compareIStringASCII(name, XMLUni::fgDOMSchemaLocation) == 0 ||
            XMLString::compareIStringASCII(name, XMLUni::fgDOMSchemaType) == 0)
      return false;

    return false;
}